

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreLowerPeeps.cpp
# Opt level: O0

Instr * __thiscall Lowerer::PeepShl(Lowerer *this,Instr *instrShl)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  Opnd *this_00;
  RegOpnd *pRVar4;
  Instr *this_01;
  Opnd *pOVar5;
  IntConstOpnd *pIVar6;
  long lVar7;
  long lVar8;
  undefined4 *puVar9;
  Instr *local_68;
  IntConstType oldValue;
  Instr *instrIter;
  Instr *instrIterStop;
  Instr *__prevInstrCheck;
  Instr *instrDef;
  Opnd *src2;
  Opnd *src1;
  Instr *instrShl_local;
  Lowerer *this_local;
  
  pOVar3 = IR::Instr::GetSrc1(instrShl);
  this_00 = IR::Instr::GetSrc2(instrShl);
  bVar2 = IR::Opnd::IsRegOpnd(pOVar3);
  if ((bVar2) && (bVar2 = IR::Opnd::IsIntConstOpnd(this_00), bVar2)) {
    pRVar4 = IR::Opnd::AsRegOpnd(pOVar3);
    bVar2 = StackSym::IsSingleDef(pRVar4->m_sym);
    if ((bVar2) && (bVar2 = IR::Instr::HasBailOutInfo(instrShl), !bVar2)) {
      pRVar4 = IR::Opnd::AsRegOpnd(pOVar3);
      this_01 = StackSym::GetInstrDef(pRVar4->m_sym);
      if (this_01->m_opcode == Shr_I4) {
        pOVar5 = IR::Instr::GetSrc2(this_01);
        bVar2 = IR::Opnd::IsIntConstOpnd(pOVar5);
        if (bVar2) {
          pOVar5 = IR::Instr::GetSrc2(this_01);
          pIVar6 = IR::Opnd::AsIntConstOpnd(pOVar5);
          lVar7 = IR::EncodableOpnd<long>::GetValue(&pIVar6->super_EncodableOpnd<long>);
          pIVar6 = IR::Opnd::AsIntConstOpnd(this_00);
          lVar8 = IR::EncodableOpnd<long>::GetValue(&pIVar6->super_EncodableOpnd<long>);
          if (lVar7 == lVar8) {
            pOVar5 = IR::Instr::GetSrc1(this_01);
            bVar2 = IR::Opnd::IsRegOpnd(pOVar5);
            if (((bVar2) && (bVar2 = IR::Opnd::GetIsDead(pOVar3), bVar2)) &&
               (bVar2 = IR::Instr::HasBailOutInfo(this_01), !bVar2)) {
              instrIterStop = (Instr *)0x0;
              if (instrShl->m_prev == (Instr *)0x0) {
                local_68 = (Instr *)0x0;
              }
              else {
                local_68 = instrShl->m_prev->m_next;
              }
              for (oldValue = (IntConstType)this_01->m_next; (Instr *)oldValue != local_68;
                  oldValue = *(IntConstType *)(oldValue + 0x10)) {
                if ((instrIterStop != (Instr *)0x0) && (instrIterStop->m_next != (Instr *)oldValue))
                {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                                     ,0xf3,
                                     "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instrIter)"
                                     ,"Modifying instr list but not using EDITING iterator!");
                  if (!bVar2) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar9 = 0;
                }
                instrIterStop = (Instr *)oldValue;
                bVar2 = IR::Instr::HasBailOutInfo((Instr *)oldValue);
                if (bVar2) {
                  return instrShl;
                }
                pOVar5 = IR::Instr::GetSrc1(this_01);
                pRVar4 = IR::Opnd::AsRegOpnd(pOVar5);
                pRVar4 = IR::Instr::FindRegDef((Instr *)oldValue,pRVar4->m_sym);
                if (pRVar4 != (RegOpnd *)0x0) {
                  return instrShl;
                }
                pRVar4 = IR::Opnd::AsRegOpnd(pOVar3);
                bVar2 = IR::Instr::HasSymUse((Instr *)oldValue,pRVar4->m_sym);
                if (bVar2) {
                  return instrShl;
                }
                bVar2 = IR::Instr::IsBranchInstr((Instr *)oldValue);
                if (bVar2) {
                  return instrShl;
                }
              }
              IR::Instr::FreeSrc1(instrShl);
              pOVar3 = IR::Instr::UnlinkSrc1(this_01);
              IR::Instr::SetSrc1(instrShl,pOVar3);
              IR::Instr::Remove(this_01);
              pIVar6 = IR::Opnd::AsIntConstOpnd(this_00);
              lVar7 = IR::EncodableOpnd<long>::GetValue(&pIVar6->super_EncodableOpnd<long>);
              pIVar6 = IR::Opnd::AsIntConstOpnd(this_00);
              IR::IntConstOpnd::SetValue
                        (pIVar6,(long)(int)((1 << ((byte)lVar7 & 0x1f)) - 1U ^ 0xffffffff));
              instrShl->m_opcode = And_I4;
            }
          }
        }
      }
    }
  }
  return instrShl;
}

Assistant:

IR::Instr *Lowerer::PeepShl(IR::Instr *instrShl)
{
    IR::Opnd *src1;
    IR::Opnd *src2;
    IR::Instr *instrDef;

    src1 = instrShl->GetSrc1();
    src2 = instrShl->GetSrc2();

    // Peep:
    //    t1 = SHR X, cst
    //    t2 = SHL t1, cst
    //
    // Into:
    //    t2 = AND X, mask

    if (!src1->IsRegOpnd() || !src2->IsIntConstOpnd())
    {
        return instrShl;
    }
    if (!src1->AsRegOpnd()->m_sym->IsSingleDef())
    {
        return instrShl;
    }
    if (instrShl->HasBailOutInfo())
    {
        return instrShl;
    }
    instrDef = src1->AsRegOpnd()->m_sym->GetInstrDef();
    if (instrDef->m_opcode != Js::OpCode::Shr_I4 || !instrDef->GetSrc2()->IsIntConstOpnd()
        || instrDef->GetSrc2()->AsIntConstOpnd()->GetValue() != src2->AsIntConstOpnd()->GetValue()
        || !instrDef->GetSrc1()->IsRegOpnd())
    {
        return instrShl;
    }
    if (!src1->GetIsDead())
    {
        return instrShl;
    }
    if (instrDef->HasBailOutInfo())
    {
        return instrShl;
    }

    FOREACH_INSTR_IN_RANGE(instrIter, instrDef->m_next, instrShl->m_prev)
    {
        if (instrIter->HasBailOutInfo())
        {
            return instrShl;
        }
        if (instrIter->FindRegDef(instrDef->GetSrc1()->AsRegOpnd()->m_sym))
        {
            return instrShl;
        }
        if (instrIter->HasSymUse(src1->AsRegOpnd()->m_sym))
        {
            return instrShl;
        }
        // if any branch between def-use, don't do peeps on it because branch target might depend on the def
        if (instrIter->IsBranchInstr())
        {
            return instrShl;
        }
    } NEXT_INSTR_IN_RANGE;

    instrShl->FreeSrc1();
    instrShl->SetSrc1(instrDef->UnlinkSrc1());
    instrDef->Remove();

    IntConstType oldValue = src2->AsIntConstOpnd()->GetValue();

    // Left shift operator (<<) on arm32 is implemented by LSL which doesn't discard bits beyond lowerest 5-bit.
    // Need to discard such bits to conform to << in JavaScript. This is not a problem for x86 and x64 because
    // behavior of SHL is consistent with JavaScript but keep the below line for clarity.
    oldValue %= sizeof(int32) * 8;

    oldValue = ~((1 << oldValue) - 1);
    src2->AsIntConstOpnd()->SetValue(oldValue);

    instrShl->m_opcode = Js::OpCode::And_I4;

    return instrShl;
}